

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

TBox<double> *
lumeview::BoxFromCoords<double>
          (TBox<double> *__return_storage_ptr__,double *coords,index_t num,index_t stride)

{
  tvec3<double,_(glm::precision)0> *this;
  double dVar1;
  int i_00;
  ulong uVar2;
  double *pdVar3;
  index_t i;
  uint uVar4;
  uint uVar5;
  index_t j;
  ulong uVar6;
  
  uVar2 = 3;
  if (stride < 3) {
    uVar2 = (ulong)stride;
  }
  TBox<double>::TBox(__return_storage_ptr__,1.79769313486232e+308,-1.79769313486232e+308);
  this = &__return_storage_ptr__->maxCorner;
  for (uVar4 = 0; uVar4 < num; uVar4 = uVar4 + stride) {
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      i_00 = (int)uVar6;
      uVar5 = uVar4 + i_00;
      dVar1 = coords[uVar5];
      pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[]
                         (&__return_storage_ptr__->minCorner,i_00);
      if (dVar1 < *pdVar3) {
        dVar1 = coords[uVar5];
        pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[]
                           (&__return_storage_ptr__->minCorner,i_00);
        *pdVar3 = dVar1;
      }
      dVar1 = coords[uVar5];
      pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[](this,i_00);
      if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
        dVar1 = coords[uVar5];
        pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[](this,i_00);
        *pdVar3 = dVar1;
      }
    }
  }
  for (; stride < 3; stride = stride + 1) {
    pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[]
                       (&__return_storage_ptr__->minCorner,stride);
    *pdVar3 = 0.0;
    pdVar3 = glm::tvec3<double,_(glm::precision)0>::operator[](this,stride);
    *pdVar3 = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TBox <real_t> BoxFromCoords (const real_t* coords, index_t num, index_t stride)
{
	const index_t cmps = std::min<index_t> (stride, 3);

	TBox <real_t> b (numeric_limits<real_t>::max(), numeric_limits<real_t>::lowest());
	for(index_t i = 0; i < num; i+=stride){
		for(index_t j = 0; j < cmps; ++j){
			if (coords [i+j] < b.minCorner[j])
				b.minCorner[j] = coords [i+j];
			if (coords [i+j] > b.maxCorner[j])
				b.maxCorner[j] = coords [i+j];
		}
	}

	for(index_t i = stride; i < 3; ++i){
		b.minCorner[i] = 0;
		b.maxCorner[i] = 0;
	}

	return b;
}